

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp.hpp
# Opt level: O1

void duckdb::alp::AlpCompression<float,_true>::FindBestFactorAndExponent
               (float *input_vector,idx_t n_values,State *state)

{
  pointer pAVar1;
  double dVar2;
  char cVar3;
  AlpEncodingIndices AVar4;
  uint64_t uVar5;
  AlpEncodingIndices AVar6;
  ulong uVar7;
  ushort uVar8;
  ulong uVar9;
  long lVar10;
  uint64_t uVar11;
  AlpCombination *combination;
  pointer pAVar12;
  undefined1 auVar13 [16];
  vector<float,_true> vector_sample;
  vector<float,_true> local_58;
  State *local_38;
  
  local_58.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_58.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (float *)0x0;
  local_58.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_38 = state;
  if (n_values != 0) {
    auVar13._8_4_ = (int)(n_values >> 0x20);
    auVar13._0_8_ = n_values;
    auVar13._12_4_ = 0x45300000;
    dVar2 = ceil(((auVar13._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)n_values) - 4503599627370496.0)) * 0.03125);
    uVar7 = 1;
    if (1 < (uint)(long)dVar2) {
      uVar7 = (long)dVar2 & 0xffffffff;
    }
    uVar9 = 0;
    do {
      if (local_58.super_vector<float,_std::allocator<float>_>.
          super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_58.super_vector<float,_std::allocator<float>_>.
          super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        ::std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)&local_58,
                   (iterator)
                   local_58.super_vector<float,_std::allocator<float>_>.
                   super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                   ._M_finish,input_vector);
      }
      else {
        *local_58.super_vector<float,_std::allocator<float>_>.
         super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
             = *input_vector;
        local_58.super_vector<float,_std::allocator<float>_>.
        super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
             = local_58.super_vector<float,_std::allocator<float>_>.
               super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
               _M_finish + 1;
      }
      uVar9 = uVar9 + uVar7;
      input_vector = input_vector + uVar7;
    } while (uVar9 < n_values);
  }
  pAVar12 = (local_38->best_k_combinations).
            super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
            super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pAVar1 = (local_38->best_k_combinations).
           super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
           super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pAVar12 == pAVar1) {
    AVar4.exponent = '\0';
    AVar4.factor = '\0';
  }
  else {
    uVar11 = 0xffffffffffffffff;
    lVar10 = 0;
    uVar8 = 0;
    AVar6.exponent = '\0';
    AVar6.factor = '\0';
    do {
      uVar5 = DryCompressToEstimateSize<false>(&local_58,SUB42(*(undefined4 *)pAVar12,0));
      if (uVar5 < uVar11) {
        AVar6 = pAVar12->encoding_indices;
        uVar8 = (ushort)AVar6 >> 8;
        lVar10 = 0;
        cVar3 = '\0';
        uVar11 = uVar5;
      }
      else {
        lVar10 = lVar10 + 1;
        cVar3 = (lVar10 != 2) + '\x05';
      }
    } while (((cVar3 == '\x06') || (cVar3 == '\0')) && (pAVar12 = pAVar12 + 1, pAVar12 != pAVar1));
    AVar4 = (AlpEncodingIndices)((ushort)AVar6 & 0xff | uVar8 << 8);
  }
  local_38->vector_encoding_indices = AVar4;
  if (local_58.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_58.super_vector<float,_std::allocator<float>_>.
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void FindBestFactorAndExponent(const T *input_vector, idx_t n_values, State &state) {
		//! We sample equidistant values within a vector; to do this we skip a fixed number of values
		vector<T> vector_sample;
		auto idx_increments = MaxValue<uint32_t>(
		    1, ExactNumericCast<uint32_t>(std::ceil((double)n_values / AlpConstants::SAMPLES_PER_VECTOR)));
		for (idx_t i = 0; i < n_values; i += idx_increments) {
			vector_sample.push_back(input_vector[i]);
		}

		AlpEncodingIndices best_encoding_indices = {0, 0};
		uint64_t best_total_bits = NumericLimits<uint64_t>::Maximum();
		idx_t worse_total_bits_counter = 0;

		//! We try each K combination in search for the one which minimize the compression size in the vector
		for (auto &combination : state.best_k_combinations) {
			uint64_t estimated_compression_size =
			    DryCompressToEstimateSize<false>(vector_sample, combination.encoding_indices);

			// If current compression size is worse (higher) or equal than the current best combination
			if (estimated_compression_size >= best_total_bits) {
				worse_total_bits_counter += 1;
				// Early exit strategy
				if (worse_total_bits_counter == AlpConstants::SAMPLING_EARLY_EXIT_THRESHOLD) {
					break;
				}
				continue;
			}
			// Otherwise we replace the best and continue trying with the next combination
			best_total_bits = estimated_compression_size;
			best_encoding_indices = combination.encoding_indices;
			worse_total_bits_counter = 0;
		}
		state.vector_encoding_indices = best_encoding_indices;
	}